

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O1

NFRule * __thiscall icu_63::NFRuleSet::findDoubleRule(NFRuleSet *this,double number)

{
  UBool UVar1;
  NFRule *pNVar2;
  int64_t number_00;
  double dVar3;
  
  if (this->fIsFractionRuleSet != '\0') {
    pNVar2 = findFractionRuleSetRule(this,number);
    return pNVar2;
  }
  UVar1 = uprv_isNaN_63(number);
  if (UVar1 == '\0') {
    if (number < 0.0) {
      if (this->nonNumericalRules[0] != (NFRule *)0x0) {
        return this->nonNumericalRules[0];
      }
      number = -number;
    }
    UVar1 = uprv_isInfinite_63(number);
    if (UVar1 == '\0') {
      dVar3 = uprv_floor_63(number);
      if ((((number == dVar3) && (!NAN(number) && !NAN(dVar3))) ||
          ((pNVar2 = this->nonNumericalRules[2], pNVar2 == (NFRule *)0x0 || 1.0 <= number &&
           (pNVar2 = this->nonNumericalRules[1], pNVar2 == (NFRule *)0x0)))) &&
         (pNVar2 = this->nonNumericalRules[3], pNVar2 == (NFRule *)0x0)) {
        number_00 = util64_fromDouble(number + 0.5);
        pNVar2 = findNormalRule(this,number_00);
        return pNVar2;
      }
    }
    else {
      pNVar2 = this->nonNumericalRules[4];
      if (pNVar2 == (NFRule *)0x0) {
        pNVar2 = RuleBasedNumberFormat::getDefaultInfinityRule(this->owner);
        return pNVar2;
      }
    }
  }
  else {
    pNVar2 = this->nonNumericalRules[5];
    if (pNVar2 == (NFRule *)0x0) {
      pNVar2 = RuleBasedNumberFormat::getDefaultNaNRule(this->owner);
      return pNVar2;
    }
  }
  return pNVar2;
}

Assistant:

const NFRule*
NFRuleSet::findDoubleRule(double number) const
{
    // if this is a fraction rule set, use findFractionRuleSetRule()
    if (isFractionRuleSet()) {
        return findFractionRuleSetRule(number);
    }

    if (uprv_isNaN(number)) {
        const NFRule *rule = nonNumericalRules[NAN_RULE_INDEX];
        if (!rule) {
            rule = owner->getDefaultNaNRule();
        }
        return rule;
    }

    // if the number is negative, return the negative number rule
    // (if there isn't a negative-number rule, we pretend it's a
    // positive number)
    if (number < 0) {
        if (nonNumericalRules[NEGATIVE_RULE_INDEX]) {
            return  nonNumericalRules[NEGATIVE_RULE_INDEX];
        } else {
            number = -number;
        }
    }

    if (uprv_isInfinite(number)) {
        const NFRule *rule = nonNumericalRules[INFINITY_RULE_INDEX];
        if (!rule) {
            rule = owner->getDefaultInfinityRule();
        }
        return rule;
    }

    // if the number isn't an integer, we use one of the fraction rules...
    if (number != uprv_floor(number)) {
        // if the number is between 0 and 1, return the proper
        // fraction rule
        if (number < 1 && nonNumericalRules[PROPER_FRACTION_RULE_INDEX]) {
            return nonNumericalRules[PROPER_FRACTION_RULE_INDEX];
        }
        // otherwise, return the improper fraction rule
        else if (nonNumericalRules[IMPROPER_FRACTION_RULE_INDEX]) {
            return nonNumericalRules[IMPROPER_FRACTION_RULE_INDEX];
        }
    }

    // if there's a master rule, use it to format the number
    if (nonNumericalRules[MASTER_RULE_INDEX]) {
        return nonNumericalRules[MASTER_RULE_INDEX];
    }

    // and if we haven't yet returned a rule, use findNormalRule()
    // to find the applicable rule
    int64_t r = util64_fromDouble(number + 0.5);
    return findNormalRule(r);
}